

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicLinearAllocator.hpp
# Opt level: O0

LayoutElement * __thiscall
Diligent::DynamicLinearAllocator::ConstructArray<Diligent::LayoutElement>
          (DynamicLinearAllocator *this,size_t count)

{
  LayoutElement *pLVar1;
  ulong local_28;
  size_t i;
  LayoutElement *Ptr;
  size_t count_local;
  DynamicLinearAllocator *this_local;
  
  pLVar1 = Allocate<Diligent::LayoutElement>(this,count);
  for (local_28 = 0; local_28 < count; local_28 = local_28 + 1) {
    LayoutElement::LayoutElement(pLVar1 + local_28);
  }
  return pLVar1;
}

Assistant:

NODISCARD T* ConstructArray(size_t count, const Args&... args)
    {
        T* Ptr = Allocate<T>(count);
        for (size_t i = 0; i < count; ++i)
        {
            new (Ptr + i) T{args...};
        }
        return Ptr;
    }